

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  int *ilimit_w;
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  BYTE *pBVar9;
  size_t sVar10;
  int iVar11;
  int *piVar12;
  U32 UVar13;
  ulong uVar14;
  long lVar15;
  int *ip;
  seqDef *psVar16;
  BYTE *pBVar17;
  uint uVar18;
  uint local_9c;
  uint local_98;
  U32 maxDistance;
  int local_70;
  size_t ofbCandidate;
  BYTE *local_60;
  BYTE *local_58;
  int *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar4 = (ms->window).base;
  local_58 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_60 = pBVar4 + uVar2;
  local_50 = (int *)(local_58 + uVar2);
  local_40 = local_58 + (ms->window).lowLimit;
  uVar6 = (ms->cParams).windowLog;
  uVar18 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar18 < 6) {
    uVar7 = uVar18;
  }
  uVar18 = 4;
  if (4 < uVar7) {
    uVar18 = uVar7;
  }
  local_98 = *rep;
  local_9c = rep[1];
  ms->lazySkipping = 0;
  uVar6 = 1 << ((byte)uVar6 & 0x1f);
  ip = (int *)((ulong)(local_60 == (BYTE *)src) + (long)src);
  iEnd = (int *)(srcSize + (long)src);
  local_48 = (int *)((long)src + (srcSize - 8));
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_38 = rep;
LAB_00149c31:
  do {
    if (local_48 <= ip) {
      *local_38 = local_98;
      local_38[1] = local_9c;
      return (long)iEnd - (long)src;
    }
    local_70 = (int)pBVar4;
    iVar11 = ((int)ip - local_70) + 1;
    UVar3 = (ms->window).lowLimit;
    UVar13 = iVar11 - uVar6;
    if (iVar11 - UVar3 <= uVar6) {
      UVar13 = UVar3;
    }
    if (ms->loadedDictEnd != 0) {
      UVar13 = UVar3;
    }
    uVar7 = iVar11 - local_98;
    if (((uVar2 - 1) - uVar7 < 3) || (iVar11 - UVar13 < local_98)) {
LAB_00149c9a:
      ofbCandidate = 999999999;
      if (uVar18 == 6) {
        uVar8 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar18 == 5) {
        uVar8 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar8 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,(BYTE *)iEnd,&ofbCandidate);
      }
      if (uVar8 < 4) {
        uVar8 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar8 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar8);
        goto LAB_00149c31;
      }
      sVar10 = ofbCandidate;
      if (3 < ofbCandidate) {
        uVar14 = (long)ip + (-(long)pBVar4 - ofbCandidate) + 3;
        pBVar17 = local_60;
        pBVar9 = pBVar4;
        if ((uint)uVar14 < uVar2) {
          pBVar17 = local_40;
          pBVar9 = local_58;
        }
        pBVar9 = pBVar9 + (uVar14 & 0xffffffff);
        for (; ((src < ip && (pBVar17 < pBVar9)) && (*(BYTE *)((long)ip + -1) == pBVar9[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar9 = pBVar9 + -1;
          uVar8 = uVar8 + 1;
        }
        local_9c = local_98;
        local_98 = (int)ofbCandidate - 3;
      }
    }
    else {
      pBVar9 = pBVar4;
      if (uVar7 < uVar2) {
        pBVar9 = local_58;
      }
      if (*(int *)((long)ip + 1) != *(int *)(pBVar9 + uVar7)) goto LAB_00149c9a;
      piVar12 = iEnd;
      if (uVar7 < uVar2) {
        piVar12 = local_50;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),pBVar9 + (ulong)uVar7 + 4,(BYTE *)iEnd,
                          (BYTE *)piVar12,local_60);
      uVar8 = sVar10 + 4;
      ip = (int *)((long)ip + 1);
      sVar10 = 1;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0014a0ea:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0014a147:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar14 = (long)ip - (long)src;
    pBVar9 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar9 + uVar14) {
LAB_0014a109:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < ip) {
LAB_0014a128:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar9,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_00149e39:
      seqStore->lit = seqStore->lit + uVar14;
      if (0xffff < uVar14) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar9 = *src;
      *(undefined8 *)(pBVar9 + 8) = uVar5;
      pBVar9 = seqStore->lit;
      if (0x10 < uVar14) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar9 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar9 + 0x18) = uVar5;
        if (0x20 < (long)uVar14) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
            uVar5 = puVar1[1];
            pBVar17 = pBVar9 + lVar15 + 0x20;
            *(undefined8 *)pBVar17 = *puVar1;
            *(undefined8 *)(pBVar17 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar17 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar17 + 0x18) = uVar5;
            lVar15 = lVar15 + 0x20;
          } while (pBVar17 + 0x20 < pBVar9 + uVar14);
        }
        goto LAB_00149e39;
      }
      seqStore->lit = pBVar9 + uVar14;
    }
    psVar16 = seqStore->sequences;
    psVar16->litLength = (U16)uVar14;
    psVar16->offBase = (U32)sVar10;
    if (uVar8 < 3) {
LAB_0014a166:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0014a185:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar16->mlBase = (U16)(uVar8 - 3);
    psVar16 = psVar16 + 1;
    seqStore->sequences = psVar16;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar7 = local_9c;
    for (ip = (int *)((long)ip + uVar8); local_9c = uVar7, src = ip, ip <= local_48;
        ip = (int *)((long)ip + sVar10 + 4)) {
      iVar11 = (int)ip - local_70;
      UVar3 = (ms->window).lowLimit;
      UVar13 = iVar11 - uVar6;
      if (iVar11 - UVar3 <= uVar6) {
        UVar13 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar3;
      }
      uVar7 = iVar11 - local_9c;
      pBVar9 = pBVar4;
      if (uVar7 < uVar2) {
        pBVar9 = local_58;
      }
      if ((((uVar2 - 1) - uVar7 < 3) || (iVar11 - UVar13 < local_9c)) ||
         (*ip != *(int *)(pBVar9 + uVar7))) break;
      piVar12 = iEnd;
      if (uVar7 < uVar2) {
        piVar12 = local_50;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar9 + uVar7) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar12,local_60);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar16 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014a0ea;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014a147;
      pBVar9 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar9) goto LAB_0014a109;
      if (iEnd < ip) goto LAB_0014a128;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar9,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar9 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar9 + 8) = uVar5;
      }
      psVar16 = seqStore->sequences;
      psVar16->litLength = 0;
      psVar16->offBase = 1;
      if (sVar10 + 4 < 3) goto LAB_0014a166;
      if (0xffff < sVar10 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014a185;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar16->mlBase = (U16)(sVar10 + 1);
      psVar16 = psVar16 + 1;
      seqStore->sequences = psVar16;
      uVar7 = local_98;
      local_98 = local_9c;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}